

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

UnknownFieldSet * __thiscall
google::protobuf::internal::InternalMetadata::
mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  undefined8 *puVar1;
  Arena *this_00;
  
  this_00 = (Arena *)this->ptr_;
  if (((ulong)this_00 & 1) != 0) {
    this_00 = *(Arena **)((ulong)this_00 & 0xfffffffffffffffe);
  }
  if (this_00 == (Arena *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation
                (this_00,(type_info *)&Container<google::protobuf::UnknownFieldSet>::typeinfo,0x20);
    }
    puVar1 = (undefined8 *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (&this_00->impl_,0x20,
                        arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                       );
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
  }
  this->ptr_ = (void *)((ulong)puVar1 | 1);
  *puVar1 = this_00;
  return (UnknownFieldSet *)(puVar1 + 1);
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container<T>* container = Arena::Create<Container<T>>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }